

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O3

RefPtr<wabt::interp::Table> * __thiscall
wabt::interp::Store::Alloc<wabt::interp::Table,wabt::interp::Store&,wabt::interp::TableType&>
          (RefPtr<wabt::interp::Table> *__return_storage_ptr__,Store *this,Store *args,
          TableType *args_1)

{
  size_type __new_size;
  undefined4 uVar1;
  bool bVar2;
  Table *pTVar3;
  Ref ref;
  Table *local_30;
  
  pTVar3 = (Table *)operator_new(0x80);
  __new_size = (args_1->limits).initial;
  (pTVar3->super_Extern).super_Object.kind_ = Table;
  (pTVar3->super_Extern).super_Object.host_info_ = (void *)0x0;
  (pTVar3->super_Extern).super_Object.self_.index = 0;
  (pTVar3->super_Extern).super_Object.finalizer_.super__Function_base._M_manager =
       (_Manager_type)0x0;
  (pTVar3->super_Extern).super_Object.finalizer_._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(pTVar3->super_Extern).super_Object.finalizer_.super__Function_base._M_functor = 0
  ;
  *(undefined8 *)
   ((long)&(pTVar3->super_Extern).super_Object.finalizer_.super__Function_base._M_functor + 8) = 0;
  (pTVar3->super_Extern).super_Object._vptr_Object = (_func_int **)&PTR__Table_001e4718;
  (pTVar3->type_).super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_001e48e0;
  uVar1 = *(undefined4 *)&(args_1->super_ExternType).field_0xc;
  (pTVar3->type_).super_ExternType.kind = (args_1->super_ExternType).kind;
  *(undefined4 *)&(pTVar3->type_).super_ExternType.field_0xc = uVar1;
  (pTVar3->type_).limits.initial = __new_size;
  bVar2 = (args_1->limits).is_shared;
  (pTVar3->type_).limits.has_max = (args_1->limits).has_max;
  (pTVar3->type_).limits.is_shared = bVar2;
  (pTVar3->type_).limits.max = (args_1->limits).max;
  (pTVar3->elements_).super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pTVar3->elements_).super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pTVar3->elements_).super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::resize
            (&pTVar3->elements_,__new_size);
  local_30 = pTVar3;
  ref.index = FreeList<std::unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>>>
              ::New<wabt::interp::Table*>
                        ((FreeList<std::unique_ptr<wabt::interp::Object,std::default_delete<wabt::interp::Object>>>
                          *)&this->objects_,&local_30);
  RefPtr<wabt::interp::Table>::RefPtr(__return_storage_ptr__,this,ref);
  (__return_storage_ptr__->obj_->super_Extern).super_Object.self_.index = ref.index;
  return __return_storage_ptr__;
}

Assistant:

RefPtr<T> Store::Alloc(Args&&... args) {
  Ref ref{objects_.New(new T(std::forward<Args>(args)...))};
  RefPtr<T> ptr{*this, ref};
  ptr->self_ = ref;
  return ptr;
}